

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O1

void compRHS(double **F,double **G,double **RHS,lattice *grid,double delt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar3 = grid->deli;
  if (0 < (int)uVar3) {
    uVar1 = grid->delx;
    uVar2 = grid->dely;
    iVar4 = grid->delj;
    lVar9 = 1;
    do {
      if (0 < iVar4) {
        pdVar5 = F[lVar9 + -1];
        pdVar6 = F[lVar9];
        pdVar7 = G[lVar9];
        pdVar8 = RHS[lVar9 + -1];
        lVar10 = 0;
        do {
          auVar11._0_8_ = pdVar6[lVar10 + 1] - pdVar5[lVar10 + 1];
          auVar11._8_8_ = pdVar7[lVar10 + 1] - pdVar7[lVar10];
          auVar12._8_8_ = delt * (double)uVar2;
          auVar12._0_8_ = delt * (double)uVar1;
          auVar12 = divpd(auVar11,auVar12);
          pdVar8[lVar10] = auVar12._8_8_ + auVar12._0_8_;
          lVar10 = lVar10 + 1;
        } while ((ulong)(iVar4 + 1) - 1 != lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != (ulong)uVar3 + 1);
  }
  return;
}

Assistant:

void compRHS (REAL **F, REAL **G, REAL **RHS, lattice *grid, REAL delt)
{
	REAL facX = delt*(grid->delx);
	REAL facY = delt*(grid->dely);
	REAL tmp;
	for (int i = 1; i <= grid->deli; i++)
		for (int j = 1; j <= grid->delj; j++)
		{
			tmp = (F[i][j] - F[i-1][j])/facX;
			RHS[i-1][j-1] = tmp + (G[i][j] - G[i][j-1])/facY;
		}
	return;
}